

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LSTMWeightParams::MergeFrom(LSTMWeightParams *this,LSTMWeightParams *from)

{
  LogMessage *other;
  WeightParams *pWVar1;
  undefined1 *puVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x8df1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->inputgateweightmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_inputgateweightmatrix(this);
    puVar2 = (undefined1 *)from->inputgateweightmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->forgetgateweightmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_forgetgateweightmatrix(this);
    puVar2 = (undefined1 *)from->forgetgateweightmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->blockinputweightmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_blockinputweightmatrix(this);
    puVar2 = (undefined1 *)from->blockinputweightmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->outputgateweightmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_outputgateweightmatrix(this);
    puVar2 = (undefined1 *)from->outputgateweightmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->inputgaterecursionmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_inputgaterecursionmatrix(this);
    puVar2 = (undefined1 *)from->inputgaterecursionmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->forgetgaterecursionmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_forgetgaterecursionmatrix(this);
    puVar2 = (undefined1 *)from->forgetgaterecursionmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->blockinputrecursionmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_blockinputrecursionmatrix(this);
    puVar2 = (undefined1 *)from->blockinputrecursionmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->outputgaterecursionmatrix_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_outputgaterecursionmatrix(this);
    puVar2 = (undefined1 *)from->outputgaterecursionmatrix_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->inputgatebiasvector_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_inputgatebiasvector(this);
    puVar2 = (undefined1 *)from->inputgatebiasvector_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->forgetgatebiasvector_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_forgetgatebiasvector(this);
    puVar2 = (undefined1 *)from->forgetgatebiasvector_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->blockinputbiasvector_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_blockinputbiasvector(this);
    puVar2 = (undefined1 *)from->blockinputbiasvector_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->outputgatebiasvector_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_outputgatebiasvector(this);
    puVar2 = (undefined1 *)from->outputgatebiasvector_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->inputgatepeepholevector_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_inputgatepeepholevector(this);
    puVar2 = (undefined1 *)from->inputgatepeepholevector_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->forgetgatepeepholevector_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_forgetgatepeepholevector(this);
    puVar2 = (undefined1 *)from->forgetgatepeepholevector_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (LSTMWeightParams *)_LSTMWeightParams_default_instance_) &&
     (from->outputgatepeepholevector_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_outputgatepeepholevector(this);
    puVar2 = (undefined1 *)from->outputgatepeepholevector_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void LSTMWeightParams::MergeFrom(const LSTMWeightParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.LSTMWeightParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_has_inputgateweightmatrix()) {
    _internal_mutable_inputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgateweightmatrix());
  }
  if (from._internal_has_forgetgateweightmatrix()) {
    _internal_mutable_forgetgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgateweightmatrix());
  }
  if (from._internal_has_blockinputweightmatrix()) {
    _internal_mutable_blockinputweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputweightmatrix());
  }
  if (from._internal_has_outputgateweightmatrix()) {
    _internal_mutable_outputgateweightmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgateweightmatrix());
  }
  if (from._internal_has_inputgaterecursionmatrix()) {
    _internal_mutable_inputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgaterecursionmatrix());
  }
  if (from._internal_has_forgetgaterecursionmatrix()) {
    _internal_mutable_forgetgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgaterecursionmatrix());
  }
  if (from._internal_has_blockinputrecursionmatrix()) {
    _internal_mutable_blockinputrecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputrecursionmatrix());
  }
  if (from._internal_has_outputgaterecursionmatrix()) {
    _internal_mutable_outputgaterecursionmatrix()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgaterecursionmatrix());
  }
  if (from._internal_has_inputgatebiasvector()) {
    _internal_mutable_inputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgatebiasvector());
  }
  if (from._internal_has_forgetgatebiasvector()) {
    _internal_mutable_forgetgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgatebiasvector());
  }
  if (from._internal_has_blockinputbiasvector()) {
    _internal_mutable_blockinputbiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_blockinputbiasvector());
  }
  if (from._internal_has_outputgatebiasvector()) {
    _internal_mutable_outputgatebiasvector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgatebiasvector());
  }
  if (from._internal_has_inputgatepeepholevector()) {
    _internal_mutable_inputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_inputgatepeepholevector());
  }
  if (from._internal_has_forgetgatepeepholevector()) {
    _internal_mutable_forgetgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_forgetgatepeepholevector());
  }
  if (from._internal_has_outputgatepeepholevector()) {
    _internal_mutable_outputgatepeepholevector()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_outputgatepeepholevector());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}